

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O0

pair<glm::vec<2,_int,_(glm::qualifier)0>,_float>
vera::FindCandidate(Image *_image,ivec2 p0,ivec2 p1,ivec2 p2)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  vec<2,_int,_(glm::qualifier)0> c;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int *piVar9;
  undefined4 extraout_var_01;
  Image *pIVar10;
  float fVar11;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 extraout_XMM0_Da_02;
  pair<glm::vec<2,_int,_(glm::qualifier)0>,_float> pVar12;
  vec<2,_int,_(glm::qualifier)0> local_134;
  float local_128;
  float dz;
  float z;
  int x;
  int iStack_118;
  bool wasInside;
  int w2;
  int w1;
  int w0;
  int local_108;
  int local_104;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 local_100;
  int dx;
  int y;
  ivec2 maxPoint;
  float maxError;
  float z2;
  float z1;
  float z0;
  float a;
  int b20;
  int a20;
  int b12;
  int a12;
  int b01;
  int a01;
  int local_98;
  int w02;
  int local_7c;
  int w01;
  int local_60;
  vec<2,_int,_(glm::qualifier)0> vStack_5c;
  int w00;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 local_54;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aStack_50;
  ivec2 max;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 local_44;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aStack_40;
  ivec2 min;
  anon_class_1_0_00000001 edge;
  Image *_image_local;
  ivec2 p2_local;
  ivec2 p1_local;
  ivec2 p0_local;
  
  unique0x10000462 = _image;
  _image_local = (Image *)p2;
  p2_local = p1;
  p1_local = p0;
  max = glm::min<2,int,(glm::qualifier)0>(&p1_local,&p2_local);
  c = glm::min<2,int,(glm::qualifier)0>(&max,(vec<2,_int,_(glm::qualifier)0> *)&_image_local);
  vStack_5c = glm::max<2,int,(glm::qualifier)0>(&p1_local,&p2_local);
  _local_54 = glm::max<2,int,(glm::qualifier)0>
                        (&stack0xffffffffffffffa4,(vec<2,_int,_(glm::qualifier)0> *)&_image_local);
  local_60 = FindCandidate::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)((long)&min.field_0 + 3),p2_local,
                        (ivec2)_image_local,c);
  local_7c = FindCandidate::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)((long)&min.field_0 + 3),(ivec2)_image_local,
                        p1_local,c);
  local_98 = FindCandidate::anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)((long)&min.field_0 + 3),p1_local,p2_local,c);
  iVar2 = p2_local.field_1.y - p1_local.field_1.y;
  iVar3 = p1_local.field_0.x - p2_local.field_0.x;
  iVar4 = _image_local._4_4_ - p2_local.field_1.y;
  iVar5 = p2_local.field_0.x - (int)_image_local;
  iVar6 = p1_local.field_1.y - _image_local._4_4_;
  iVar7 = (int)_image_local - p1_local.field_0.x;
  iVar8 = FindCandidate::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)((long)&min.field_0 + 3),p1_local,p2_local,
                     (ivec2)_image_local);
  pIVar10 = stack0xffffffffffffffc8;
  fVar11 = (float)iVar8;
  iVar8 = (*stack0xffffffffffffffc8->_vptr_Image[0xe])
                    (stack0xffffffffffffffc8,(long)p1_local.field_0.x,(long)p1_local.field_1.y);
  (*pIVar10->_vptr_Image[0x18])(pIVar10,CONCAT44(extraout_var,iVar8));
  pIVar10 = stack0xffffffffffffffc8;
  iVar8 = (*stack0xffffffffffffffc8->_vptr_Image[0xe])
                    (stack0xffffffffffffffc8,(long)p2_local.field_0.x,(long)p2_local.field_1.y);
  (*pIVar10->_vptr_Image[0x18])(pIVar10,CONCAT44(extraout_var_00,iVar8));
  pIVar10 = stack0xffffffffffffffc8;
  (*stack0xffffffffffffffc8->_vptr_Image[0xe])
            (stack0xffffffffffffffc8,(long)(int)_image_local,(long)_image_local._4_4_);
  (*pIVar10->_vptr_Image[0x18])();
  maxPoint.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5)(extraout_XMM0_Da_01 / fVar11);
  maxPoint.field_0.x = 0;
  glm::vec<2,_int,_(glm::qualifier)0>::vec((vec<2,_int,_(glm::qualifier)0> *)&dx,0);
  aStack_40 = c.field_1;
  local_100.y = aStack_40.y;
  do {
    if (aStack_50.y < local_100.y) {
      bVar1 = glm::operator==((vec<2,_int,_(glm::qualifier)0> *)&dx,&p1_local);
      if (((bVar1) ||
          (bVar1 = glm::operator==((vec<2,_int,_(glm::qualifier)0> *)&dx,&p2_local), bVar1)) ||
         (bVar1 = glm::operator==((vec<2,_int,_(glm::qualifier)0> *)&dx,
                                  (vec<2,_int,_(glm::qualifier)0> *)&_image_local), bVar1)) {
        maxPoint.field_0.x = 0;
      }
      pVar12 = std::make_pair<glm::vec<2,int,(glm::qualifier)0>&,float&>
                         ((vec<2,_int,_(glm::qualifier)0> *)&dx,(float *)&maxPoint);
      return pVar12;
    }
    local_104 = 0;
    if ((local_60 < 0) && (iVar4 != 0)) {
      local_108 = -local_60 / iVar4;
      piVar9 = std::max<int>(&local_104,&local_108);
      local_104 = *piVar9;
    }
    if ((local_7c < 0) && (iVar6 != 0)) {
      w0 = -local_7c / iVar6;
      piVar9 = std::max<int>(&local_104,&w0);
      local_104 = *piVar9;
    }
    if ((local_98 < 0) && (iVar2 != 0)) {
      w1 = -local_98 / iVar2;
      piVar9 = std::max<int>(&local_104,&w1);
      local_104 = *piVar9;
    }
    w2 = local_60 + iVar4 * local_104;
    iStack_118 = local_7c + iVar6 * local_104;
    x = local_98 + iVar2 * local_104;
    z._3_1_ = 0;
    local_44 = c.field_0;
    for (dz = (float)(local_44.x + local_104); pIVar10 = stack0xffffffffffffffc8,
        (int)dz <= local_54.x; dz = (float)((int)dz + 1)) {
      if (((w2 < 0) || (iStack_118 < 0)) || (x < 0)) {
        if ((z._3_1_ & 1) != 0) break;
      }
      else {
        z._3_1_ = 1;
        local_128 = (float)maxPoint.field_1 * (float)x +
                    (extraout_XMM0_Da / fVar11) * (float)w2 +
                    (extraout_XMM0_Da_00 / fVar11) * (float)iStack_118;
        iVar8 = (*stack0xffffffffffffffc8->_vptr_Image[0xe])
                          (stack0xffffffffffffffc8,(long)(int)dz,(long)local_100.y);
        (*pIVar10->_vptr_Image[0x18])(pIVar10,CONCAT44(extraout_var_01,iVar8));
        std::abs((int)pIVar10);
        if ((float)maxPoint.field_0 < (float)extraout_XMM0_Da_02) {
          maxPoint.field_0 = extraout_XMM0_Da_02;
          glm::vec<2,_int,_(glm::qualifier)0>::vec(&local_134,(int)dz,local_100.y);
          _dx = local_134;
        }
      }
      w2 = iVar4 + w2;
      iStack_118 = iVar6 + iStack_118;
      x = iVar2 + x;
    }
    local_60 = iVar5 + local_60;
    local_7c = iVar7 + local_7c;
    local_98 = iVar3 + local_98;
    local_100.y = local_100.y + 1;
  } while( true );
}

Assistant:

std::pair<glm::ivec2, float> FindCandidate( const Image& _image, const glm::ivec2 p0, const glm::ivec2 p1, const glm::ivec2 p2) { 
    
    const auto edge = []( const glm::ivec2 a, const glm::ivec2 b, const glm::ivec2 c) {
        return (b.x - c.x) * (a.y - c.y) - (b.y - c.y) * (a.x - c.x);
    };

    // triangle bounding box
    const glm::ivec2 min = glm::min(glm::min(p0, p1), p2);
    const glm::ivec2 max = glm::max(glm::max(p0, p1), p2);

    // forward differencing variables
    int w00 = edge(p1, p2, min);
    int w01 = edge(p2, p0, min);
    int w02 = edge(p0, p1, min);
    const int a01 = p1.y - p0.y;
    const int b01 = p0.x - p1.x;
    const int a12 = p2.y - p1.y;
    const int b12 = p1.x - p2.x;
    const int a20 = p0.y - p2.y;
    const int b20 = p2.x - p0.x;

    // pre-multiplied z values at vertices
    const float a = edge(p0, p1, p2);
    const float z0 = _image.getValue( _image.getIndex(p0.x, p0.y) ) / a;
    const float z1 = _image.getValue( _image.getIndex(p1.x, p1.y) ) / a;
    const float z2 = _image.getValue( _image.getIndex(p2.x, p2.y) ) / a;

    // iterate over pixels in bounding box
    float maxError = 0;
    glm::ivec2 maxPoint(0);
    for (int y = min.y; y <= max.y; y++) {
        // compute starting offset
        int dx = 0;
        if (w00 < 0 && a12 != 0)
            dx = std::max(dx, -w00 / a12);
        if (w01 < 0 && a20 != 0)
            dx = std::max(dx, -w01 / a20);
        if (w02 < 0 && a01 != 0)
            dx = std::max(dx, -w02 / a01);

        int w0 = w00 + a12 * dx;
        int w1 = w01 + a20 * dx;
        int w2 = w02 + a01 * dx;

        bool wasInside = false;

        for (int x = min.x + dx; x <= max.x; x++) {
            // check if inside triangle
            if (w0 >= 0 && w1 >= 0 && w2 >= 0) {
                wasInside = true;

                // compute z using barycentric coordinates
                const float z = z0 * w0 + z1 * w1 + z2 * w2;
                const float dz = std::abs(z - _image.getValue( _image.getIndex(x, y) ) );
                if (dz > maxError) {
                    maxError = dz;
                    maxPoint = glm::ivec2(x, y);
                }
            } else if (wasInside) {
                break;
            }

            w0 += a12;
            w1 += a20;
            w2 += a01;
        }

        w00 += b12;
        w01 += b20;
        w02 += b01;
    }

    if (maxPoint == p0 || maxPoint == p1 || maxPoint == p2) {
        maxError = 0;
    }

    return std::make_pair(maxPoint, maxError);
}